

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_addLocalCatalog(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  PyObject *pPVar4;
  xmlChar *URL;
  PyObject *pyobj_ctxt;
  long local_18;
  undefined *local_10;
  
  pPVar4 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Os:addLocalCatalog",&local_10,&local_18);
  if (iVar1 != 0) {
    if (local_10 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_10 + 0x10);
    }
    if (local_18 != 0) {
      uVar2 = xmlCtxtGetCatalogs(uVar3);
      uVar2 = xmlCatalogAddLocal(uVar2,local_18);
      xmlCtxtSetCatalogs(uVar3,uVar2);
    }
    pPVar4 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar4;
}

Assistant:

static PyObject *
libxml_addLocalCatalog(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    xmlChar *URL;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"Os:addLocalCatalog", &pyobj_ctxt, &URL))
        return(NULL);

    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    if (URL != NULL) {
        void *catalogs = xmlCtxtGetCatalogs(ctxt);
        xmlCtxtSetCatalogs(ctxt, xmlCatalogAddLocal(catalogs, URL));
    }

    Py_INCREF(Py_None);
    return (Py_None);
}